

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

Routine * env_routine_get(Routine *__return_storage_ptr__,char *identifer,int line,Environment *env)

{
  int iVar1;
  Record *pRVar2;
  Record *match;
  Environment *env_local;
  int line_local;
  char *identifer_local;
  
  pRVar2 = env_match(identifer,env);
  if (pRVar2 == (Record *)0x0) {
    iVar1 = strcmp(identifer,"Main");
    if (iVar1 == 0) {
      printf("\x1b[31m\n[Error] Unable to start! Routine Main is not defined!\x1b[0m");
    }
    else {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Routine %s is not defined!\x1b[0m",
             (ulong)(uint)line,identifer);
    }
    stop();
  }
  else if ((pRVar2->object).type != OBJECT_ROUTINE) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] %s is not a callable routine!\x1b[0m",
           (ulong)(uint)line,identifer);
    stop();
  }
  memcpy(__return_storage_ptr__,&(pRVar2->object).field_1,0x38);
  return __return_storage_ptr__;
}

Assistant:

Routine env_routine_get(char *identifer, int line, Environment *env){
    Record *match = env_match(identifer, env);
    if(match == NULL){
        if(strcmp(identifer, "Main") == 0){
            printf(error("Unable to start! Routine Main is not defined!"));
        }
        else
            printf(runtime_error("Routine %s is not defined!"), line, identifer);
        stop();
    }
    else if(match->object.type != OBJECT_ROUTINE){
        printf(runtime_error("%s is not a callable routine!"), line, identifer);
        stop();
    }
    return match->object.routine;
}